

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_quic_transport.cc
# Opt level: O2

void __thiscall
MockQuicTransport::MockQuicTransport(MockQuicTransport *this,UniquePtr<BIO> *bio,SSL *ssl)

{
  allocator_type local_1a;
  allocator_type local_19;
  
  (this->bio_)._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (bio->_M_t).super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_bio_st_*,_false>._M_head_impl;
  (bio->_M_t).super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (bio_st *)0x0;
  (this->pending_app_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pending_app_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pending_app_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>::
  vector(&this->read_levels_,4,&local_19);
  std::
  vector<MockQuicTransport::EncryptionLevel,_std::allocator<MockQuicTransport::EncryptionLevel>_>::
  vector(&this->write_levels_,4,&local_1a);
  this->ssl_ = ssl;
  return;
}

Assistant:

MockQuicTransport::MockQuicTransport(bssl::UniquePtr<BIO> bio, SSL *ssl)
    : bio_(std::move(bio)),
      read_levels_(ssl_encryption_application + 1),
      write_levels_(ssl_encryption_application + 1),
      ssl_(ssl) {}